

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_bufferMode_e ZVar1;
  ZSTD_cStreamStage ZVar2;
  void *pvVar3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  size_t err_code;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  size_t sVar13;
  void *pvVar14;
  char *dst;
  char *dst_00;
  void *pvVar15;
  ulong uVar16;
  void *src;
  ulong uVar17;
  ulong local_90;
  long local_70;
  
  if (output->size < output->pos) {
    return 0xffffffffffffffba;
  }
  uVar11 = input->size;
  uVar16 = input->pos;
  if (uVar11 < uVar16) {
    return 0xffffffffffffffb8;
  }
  if (ZSTD_e_end < endOp) {
    return 0xffffffffffffffd6;
  }
  if (cctx->streamStage == zcss_init) {
    sVar13 = (uVar11 - uVar16) + cctx->stableIn_notConsumed;
    if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable)) &&
       (sVar13 < 0x20000)) {
      if ((cctx->stableIn_notConsumed == 0) ||
         ((sVar10 = 0xffffffffffffffce, input->src == (cctx->expectedInBuffer).src &&
          (uVar16 == (cctx->expectedInBuffer).size)))) {
        input->pos = uVar11;
        (cctx->expectedInBuffer).pos = uVar11;
        uVar5 = *(undefined4 *)((long)&input->src + 4);
        sVar10 = input->size;
        uVar6 = *(undefined4 *)((long)&input->size + 4);
        *(undefined4 *)&(cctx->expectedInBuffer).src = *(undefined4 *)&input->src;
        *(undefined4 *)((long)&(cctx->expectedInBuffer).src + 4) = uVar5;
        *(int *)&(cctx->expectedInBuffer).size = (int)sVar10;
        *(undefined4 *)((long)&(cctx->expectedInBuffer).size + 4) = uVar6;
        cctx->stableIn_notConsumed = sVar13;
        sVar10 = (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
      }
      bVar7 = false;
    }
    else {
      sVar10 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar13);
      if (sVar10 < 0xffffffffffffff89) {
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
          (cctx->expectedInBuffer).pos = input->pos;
          uVar5 = *(undefined4 *)((long)&input->src + 4);
          sVar13 = input->size;
          uVar6 = *(undefined4 *)((long)&input->size + 4);
          *(undefined4 *)&(cctx->expectedInBuffer).src = *(undefined4 *)&input->src;
          *(undefined4 *)((long)&(cctx->expectedInBuffer).src + 4) = uVar5;
          *(int *)&(cctx->expectedInBuffer).size = (int)sVar13;
          *(undefined4 *)((long)&(cctx->expectedInBuffer).size + 4) = uVar6;
        }
        bVar7 = true;
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
          cctx->expectedOutBufferSize = output->size - output->pos;
        }
      }
      else {
        bVar7 = false;
      }
    }
    if (!bVar7) {
      return sVar10;
    }
  }
  ZVar1 = (cctx->appliedParams).inBufferMode;
  if (ZVar1 == ZSTD_bm_stable) {
    sVar13 = 0xffffffffffffffce;
    bVar7 = true;
    if (((cctx->expectedInBuffer).src != input->src) || ((cctx->expectedInBuffer).pos != input->pos)
       ) goto LAB_01d652b9;
  }
  if (((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) &&
     (cctx->expectedOutBufferSize != output->size - output->pos)) {
    sVar13 = 0xffffffffffffffce;
    bVar7 = true;
  }
  else {
    bVar7 = false;
    sVar13 = 0;
  }
LAB_01d652b9:
  if (!bVar7) {
    pvVar3 = input->src;
    if (pvVar3 == (void *)0x0) {
      pvVar14 = (void *)0x0;
      src = (void *)0x0;
    }
    else {
      pvVar14 = (void *)(input->size + (long)pvVar3);
      src = (void *)(input->pos + (long)pvVar3);
    }
    pvVar4 = output->dst;
    if (pvVar4 == (void *)0x0) {
      local_70 = 0;
      dst_00 = (char *)0x0;
    }
    else {
      local_70 = output->size + (long)pvVar4;
      dst_00 = (char *)(output->pos + (long)pvVar4);
    }
    if (ZVar1 == ZSTD_bm_stable) {
      sVar13 = cctx->stableIn_notConsumed;
      input->pos = input->pos - sVar13;
      if (src != (void *)0x0) {
        src = (void *)((long)src - sVar13);
      }
      cctx->stableIn_notConsumed = 0;
    }
    do {
      ZVar2 = cctx->streamStage;
      if (ZVar2 == zcss_load) {
        if (endOp == ZSTD_e_end) {
          sVar13 = (long)pvVar14 - (long)src;
          if (sVar13 < 0xff00ff00ff00ff00) {
            uVar11 = -(sVar13 - 0x20000) >> 0xb;
            if (0x1ffff < sVar13) {
              uVar11 = 0;
            }
            uVar11 = (sVar13 >> 8) + sVar13 + uVar11;
          }
          else {
            uVar11 = 0;
          }
          if (uVar11 == 0) {
            uVar11 = 0xffffffffffffffb8;
          }
          if (((uVar11 <= (ulong)(local_70 - (long)dst_00)) ||
              ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0)) {
            uVar11 = ZSTD_compressEnd_public(cctx,dst_00,local_70 - (long)dst_00,src,sVar13);
            if (0xffffffffffffff88 >= uVar11) {
              dst_00 = dst_00 + uVar11;
              cctx->streamStage = zcss_init;
              cctx->frameEnded = 1;
              cctx->pledgedSrcSizePlusOne = 0;
              src = pvVar14;
              bVar7 = 0xffffffffffffff88 < uVar11;
              goto LAB_01d655cc;
            }
            goto LAB_01d65950;
          }
        }
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
          uVar16 = cctx->inBuffTarget - cctx->inBuffPos;
          uVar11 = (long)pvVar14 - (long)src;
          if (uVar16 < (ulong)((long)pvVar14 - (long)src)) {
            uVar11 = uVar16;
          }
          if (uVar11 != 0) {
            switchD_01602a8a::default(cctx->inBuff + cctx->inBuffPos,src,uVar11);
          }
          uVar16 = uVar11 + cctx->inBuffPos;
          cctx->inBuffPos = uVar16;
          pvVar15 = (void *)((long)src + uVar11);
          if (src == (void *)0x0) {
            pvVar15 = src;
          }
          if (endOp == ZSTD_e_flush) {
            bVar8 = false;
            bVar9 = false;
            if (uVar16 != cctx->inToCompress) goto LAB_01d6559c;
          }
          else {
            if (endOp == ZSTD_e_continue) {
              bVar8 = false;
              bVar9 = false;
              if (uVar16 < cctx->inBuffTarget) goto LAB_01d655a3;
            }
LAB_01d6559c:
            bVar9 = true;
            bVar8 = true;
          }
LAB_01d655a3:
          src = pvVar15;
          bVar7 = bVar9;
          if (bVar8) {
LAB_01d6564d:
            ZVar1 = (cctx->appliedParams).inBufferMode;
            if (ZVar1 == ZSTD_bm_buffered) {
              sVar13 = cctx->inBuffPos - cctx->inToCompress;
            }
            else {
              sVar13 = (long)pvVar14 - (long)src;
              if (cctx->blockSize <= (ulong)((long)pvVar14 - (long)src)) {
                sVar13 = cctx->blockSize;
              }
            }
            if (sVar13 < 0xff00ff00ff00ff00) {
              uVar11 = -(sVar13 - 0x20000) >> 0xb;
              if (0x1ffff < sVar13) {
                uVar11 = 0;
              }
              uVar11 = (sVar13 >> 8) + sVar13 + uVar11;
            }
            else {
              uVar11 = 0;
            }
            sVar10 = local_70 - (long)dst_00;
            if (uVar11 == 0) {
              uVar11 = 0xffffffffffffffb8;
            }
            dst = dst_00;
            if ((sVar10 < uVar11) && ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
              sVar10 = cctx->outBuffSize;
              dst = cctx->outBuff;
            }
            if (ZVar1 == ZSTD_bm_buffered) {
              if (src == pvVar14 && endOp == ZSTD_e_end) {
                uVar11 = ZSTD_compressEnd_public
                                   (cctx,dst,sVar10,cctx->inBuff + cctx->inToCompress,sVar13);
              }
              else {
                uVar11 = ZSTD_compressContinue_internal
                                   (cctx,dst,sVar10,cctx->inBuff + cctx->inToCompress,sVar13,1,0);
              }
              iVar12 = 1;
              if (uVar11 < 0xffffffffffffff89) {
                cctx->frameEnded = (uint)(src == pvVar14 && endOp == ZSTD_e_end);
                uVar16 = cctx->inBuffPos + cctx->blockSize;
                cctx->inBuffTarget = uVar16;
                if (cctx->inBuffSize < uVar16) {
                  cctx->inBuffPos = 0;
                  cctx->inBuffTarget = cctx->blockSize;
                }
                cctx->inToCompress = cctx->inBuffPos;
                goto LAB_01d6585b;
              }
            }
            else {
              pvVar15 = (void *)((long)src + sVar13);
              if (pvVar15 == pvVar14 && endOp == ZSTD_e_end) {
                uVar11 = ZSTD_compressEnd_public(cctx,dst,sVar10,src,sVar13);
              }
              else {
                uVar11 = ZSTD_compressContinue_internal(cctx,dst,sVar10,src,sVar13,1,0);
              }
              if (src != (void *)0x0) {
                src = pvVar15;
              }
              iVar12 = 1;
              if (uVar11 < 0xffffffffffffff89) {
                cctx->frameEnded = (uint)(pvVar15 == pvVar14 && endOp == ZSTD_e_end);
LAB_01d6585b:
                if (dst == dst_00) {
                  dst_00 = dst_00 + uVar11;
                  iVar12 = 6;
                  uVar11 = local_90;
                  if (cctx->frameEnded != 0) {
                    cctx->streamStage = zcss_init;
                    cctx->pledgedSrcSizePlusOne = 0;
                    bVar9 = false;
                  }
                }
                else {
                  cctx->outBuffContentSize = uVar11;
                  cctx->outBuffFlushedSize = 0;
                  cctx->streamStage = zcss_flush;
                  iVar12 = 0;
                  uVar11 = local_90;
                }
              }
            }
            local_90 = uVar11;
            bVar7 = bVar9;
            if (iVar12 != 6) {
              uVar11 = local_90;
              if (iVar12 == 0) goto LAB_01d653aa;
              goto LAB_01d65950;
            }
          }
        }
        else {
          bVar9 = true;
          if (endOp == ZSTD_e_flush) {
            if (src != pvVar14) goto LAB_01d6564d;
            bVar7 = false;
          }
          else {
            if ((endOp != ZSTD_e_continue) ||
               (cctx->blockSize <= (ulong)((long)pvVar14 - (long)src))) goto LAB_01d6564d;
            cctx->stableIn_notConsumed = (long)pvVar14 - (long)src;
            src = pvVar14;
            bVar7 = false;
          }
        }
      }
      else {
        if (ZVar2 != zcss_flush) {
          bVar7 = true;
          if (ZVar2 != zcss_init) goto LAB_01d655cc;
          local_90 = 0xffffffffffffffc2;
          uVar11 = local_90;
          goto LAB_01d65950;
        }
        bVar9 = true;
LAB_01d653aa:
        uVar17 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
        uVar16 = local_70 - (long)dst_00;
        uVar11 = uVar17;
        if (uVar16 < uVar17) {
          uVar11 = uVar16;
        }
        if (uVar11 != 0) {
          switchD_01602a8a::default(dst_00,cctx->outBuff + cctx->outBuffFlushedSize,uVar11);
        }
        cctx->outBuffFlushedSize = cctx->outBuffFlushedSize + uVar11;
        dst_00 = dst_00 + uVar11;
        bVar7 = false;
        if (uVar17 <= uVar16) {
          cctx->outBuffContentSize = 0;
          cctx->outBuffFlushedSize = 0;
          if (cctx->frameEnded == 0) {
            cctx->streamStage = zcss_load;
            bVar7 = bVar9;
          }
          else {
            cctx->streamStage = zcss_init;
            cctx->pledgedSrcSizePlusOne = 0;
          }
        }
      }
LAB_01d655cc:
    } while (bVar7);
    input->pos = (long)src - (long)pvVar3;
    output->pos = (long)dst_00 - (long)pvVar4;
    if (cctx->frameEnded == 0) {
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
        uVar11 = cctx->blockSize - cctx->stableIn_notConsumed;
      }
      else {
        uVar11 = cctx->inBuffTarget - cctx->inBuffPos;
        if (uVar11 == 0) {
          uVar11 = cctx->blockSize;
        }
      }
    }
    else {
      local_90 = 0;
      uVar11 = local_90;
    }
LAB_01d65950:
    local_90 = uVar11;
    sVar13 = local_90;
    if (local_90 < 0xffffffffffffff89) {
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
        (cctx->expectedInBuffer).pos = input->pos;
        sVar13 = input->size;
        (cctx->expectedInBuffer).src = input->src;
        (cctx->expectedInBuffer).size = sVar13;
      }
      if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
        cctx->expectedOutBufferSize = output->size - output->pos;
      }
      sVar13 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
  }
  return sVar13;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}